

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_utils.h
# Opt level: O0

void sunfprintf_real(FILE *fp,SUNOutputFormat fmt,int start,char *name,sunrealtype value)

{
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  FILE *in_RDI;
  undefined8 in_XMM0_Qa;
  
  if (in_ESI == 0) {
    fprintf(in_RDI,"%-*s = %.15g\n",in_XMM0_Qa,0x1d,in_RCX);
  }
  else {
    if (in_EDX == 0) {
      fprintf(in_RDI,",");
    }
    fprintf(in_RDI,"%s,% .15e",in_XMM0_Qa,in_RCX);
  }
  return;
}

Assistant:

static inline void sunfprintf_real(FILE* fp, SUNOutputFormat fmt,
                                   sunbooleantype start, const char* name,
                                   sunrealtype value)
{
  if (fmt == SUN_OUTPUTFORMAT_TABLE)
  {
    fprintf(fp, "%-*s = " SUN_FORMAT_G "\n", SUN_TABLE_WIDTH, name, value);
  }
  else
  {
    if (!start) { fprintf(fp, ","); }
    fprintf(fp, "%s," SUN_FORMAT_E, name, value);
  }
}